

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.cpp
# Opt level: O0

SettingsValue *
common::GetSetting(Settings *settings,string *section,string *name,
                  bool ignore_default_section_config,bool ignore_nonpersistent,bool get_chain_type)

{
  SettingsValue *in_RDI;
  byte in_R8B;
  byte in_R9B;
  long in_FS_OFFSET;
  byte in_stack_00000008;
  SettingsValue *result;
  bool done;
  UniValue *in_stack_ffffffffffffff68;
  SettingsValue *fn;
  undefined1 local_c [2];
  byte local_a;
  byte local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_9 = in_R8B & 1;
  local_a = in_R9B & 1;
  local_c[1] = in_stack_00000008 & 1;
  fn = in_RDI;
  UniValue::UniValue(in_stack_ffffffffffffff68);
  local_c[0] = 0;
  (anonymous_namespace)::
  MergeSettings<common::GetSetting(common::Settings_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool,bool,bool)::__0>
            ((Settings *)&stack0xfffffffffffffff7,(string *)local_c,(string *)(local_c + 1),
             (anon_class_40_5_deb4f69c *)fn);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

SettingsValue GetSetting(const Settings& settings,
    const std::string& section,
    const std::string& name,
    bool ignore_default_section_config,
    bool ignore_nonpersistent,
    bool get_chain_type)
{
    SettingsValue result;
    bool done = false; // Done merging any more settings sources.
    MergeSettings(settings, section, name, [&](SettingsSpan span, Source source) {
        // Weird behavior preserved for backwards compatibility: Apply negated
        // setting even if non-negated setting would be ignored. A negated
        // value in the default section is applied to network specific options,
        // even though normal non-negated values there would be ignored.
        const bool never_ignore_negated_setting = span.last_negated();

        // Weird behavior preserved for backwards compatibility: Take first
        // assigned value instead of last. In general, later settings take
        // precedence over early settings, but for backwards compatibility in
        // the config file the precedence is reversed for all settings except
        // chain type settings.
        const bool reverse_precedence =
            (source == Source::CONFIG_FILE_NETWORK_SECTION || source == Source::CONFIG_FILE_DEFAULT_SECTION) &&
            !get_chain_type;

        // Weird behavior preserved for backwards compatibility: Negated
        // -regtest and -testnet arguments which you would expect to override
        // values set in the configuration file are currently accepted but
        // silently ignored. It would be better to apply these just like other
        // negated values, or at least warn they are ignored.
        const bool skip_negated_command_line = get_chain_type;

        if (done) return;

        // Ignore settings in default config section if requested.
        if (ignore_default_section_config && source == Source::CONFIG_FILE_DEFAULT_SECTION &&
            !never_ignore_negated_setting) {
            return;
        }

        // Ignore nonpersistent settings if requested.
        if (ignore_nonpersistent && (source == Source::COMMAND_LINE || source == Source::FORCED)) return;

        // Skip negated command line settings.
        if (skip_negated_command_line && span.last_negated()) return;

        if (!span.empty()) {
            result = reverse_precedence ? span.begin()[0] : span.end()[-1];
            done = true;
        } else if (span.last_negated()) {
            result = false;
            done = true;
        }
    });
    return result;
}